

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

ssize_t __thiscall
Liby::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Channel *this_00;
  _Head_base<0UL,_std::function<void_()>_*,_false> __ptr;
  _Head_base<0UL,_std::function<void_()>_*,_false> this_01;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  bool bVar2;
  undefined1 local_69;
  undefined1 local_68 [48];
  _Head_base<0UL,_std::function<void_()>_*,_false> local_38;
  Buffer *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_68._32_8_ = (element_type *)0x0;
  local_68._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_68._0_8_ = (element_type *)0x0;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_head_impl = (function<void_()> *)0x0;
  local_28 = (Buffer *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Liby::Buffer,std::allocator<Liby::Buffer>,Liby::Buffer>
            (&_Stack_20,&local_28,(allocator<Liby::Buffer> *)&local_69,
             (Buffer *)CONCAT44(in_register_00000034,__fd));
  local_68._32_8_ = local_28;
  local_68._40_8_ = _Stack_20._M_pi;
  if (*(long *)((long)__buf + 0x10) != 0) {
    this_01._M_head_impl = (function<void_()> *)operator_new(0x20);
    std::function<void_()>::function(this_01._M_head_impl,(function<void_()> *)__buf);
    __ptr._M_head_impl = local_38._M_head_impl;
    bVar2 = local_38._M_head_impl != (function<void_()> *)0x0;
    local_38._M_head_impl = this_01._M_head_impl;
    if (bVar2) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&local_38,__ptr._M_head_impl);
    }
  }
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::emplace_back<Liby::io_task>
            (&this->writTasks_,(io_task *)local_68);
  this_00 = (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00->writable_ = true;
  Channel::updateChannel(this_00);
  sVar1 = extraout_RAX;
  if (local_38._M_head_impl != (function<void_()> *)0x0) {
    std::default_delete<std::function<void_()>_>::operator()
              ((default_delete<std::function<void_()>_> *)&local_38,local_38._M_head_impl);
    sVar1 = extraout_RAX_00;
  }
  local_38._M_head_impl = (function<void_()> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._40_8_);
    sVar1 = extraout_RAX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    sVar1 = extraout_RAX_02;
  }
  return sVar1;
}

Assistant:

void Connection::send(Buffer &&buf, const BasicHandler &handler) {
    io_task task;
    task.buffer_ = std::make_shared<Buffer>(std::move(buf));
    if (handler) {
        task.handler_ = std::make_unique<BasicHandler>(handler);
    }
    writTasks_.emplace_back(std::move(task));
    enableWrit();
}